

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTests.cpp
# Opt level: O2

void __thiscall
agge::tests::PathGeneratorAdapterTests::AddingPathToSinkTranslateCloses
          (PathGeneratorAdapterTests *this)

{
  mock_path_sink s;
  path p;
  point reference [4];
  point input [2];
  allocator local_f9;
  _Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  local_f8;
  string local_e0;
  path local_c0;
  LocationInfo local_a0;
  path local_78;
  undefined1 local_58 [8];
  undefined1 auStack_50 [16];
  undefined1 auStack_40 [8];
  undefined1 local_38 [16];
  undefined1 local_28 [8];
  undefined1 auStack_20 [24];
  
  local_28._0_4_ = 11.0;
  local_28._4_4_ = 23.0;
  auStack_20._0_4_ = 0x22;
  auStack_20._4_4_ = 3.0;
  auStack_20._8_4_ = 7.0;
  auStack_20._12_4_ = 0x22;
  mocks::path::path<agge::tests::mocks::path::point,2ul>(&local_78,(point (*) [2])local_28);
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mocks::path::path(&local_c0,&local_78);
  add_path<agge::tests::PathGeneratorAdapterTests::mock_path_sink,agge::tests::mocks::path>
            ((mock_path_sink *)&local_f8,&local_c0);
  std::
  _Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  ~_Vector_base((_Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                 *)&local_c0);
  local_38._0_4_ = 2;
  local_38._4_4_ = 0.0;
  local_38._8_4_ = 0.0;
  local_38._12_4_ = 0x20;
  auStack_50._8_4_ = 0.0;
  auStack_50._12_4_ = 0x20;
  auStack_40._0_4_ = 3.0;
  auStack_40._4_4_ = 7.0;
  local_58._0_4_ = 11.0;
  local_58._4_4_ = 23.0;
  auStack_50._0_4_ = 2;
  auStack_50._4_4_ = 0.0;
  std::__cxx11::string::string
            ((string *)&local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,&local_f9);
  ut::LocationInfo::LocationInfo(&local_a0,&local_e0,0x15d);
  ut::
  are_equal<agge::tests::mocks::path::point,4ul,std::vector<agge::tests::mocks::path::point,std::allocator<agge::tests::mocks::path::point>>>
            ((point (*) [4])local_58,
             (vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
              *)&local_f8,&local_a0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::
  _Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  ~_Vector_base(&local_f8);
  std::
  _Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  ~_Vector_base((_Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                 *)&local_78);
  return;
}

Assistant:

test( AddingPathToSinkTranslateCloses )
			{
				// INIT
				mocks::path::point input[] = {
					{ 11.0f, 23.0f, path_command_line_to | path_flag_close },
					{ 3.0f, 7.0f, path_command_line_to | path_flag_close },
				};
				const mocks::path p(input);
				mock_path_sink s;

				// ACT
				add_path(s, p);

				// ASSERT
				mocks::path::point reference[] = {
					{ 11.0f, 23.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_flag_close },
					{ 3.0f, 7.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_flag_close },
				};

				assert_equal(reference, s.points);
			}